

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall
QGlobalNetworkProxy::setApplicationProxy(QGlobalNetworkProxy *this,QNetworkProxy *proxy)

{
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._0_8_ = this;
  QRecursiveMutex::lock(&this->mutex);
  local_30[8] = true;
  this_00 = this->applicationLevelProxy;
  if (this_00 == (QNetworkProxy *)0x0) {
    this_00 = (QNetworkProxy *)operator_new(8);
    QNetworkProxy::QNetworkProxy(this_00);
    this->applicationLevelProxy = this_00;
  }
  QSharedDataPointer<QNetworkProxyPrivate>::operator=(&this_00->d,&proxy->d);
  if (this->applicationLevelProxyFactory != (QNetworkProxyFactory *)0x0) {
    (*this->applicationLevelProxyFactory->_vptr_QNetworkProxyFactory[1])();
  }
  this->applicationLevelProxyFactory = (QNetworkProxyFactory *)0x0;
  this->useSystemProxies = false;
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setApplicationProxy(const QNetworkProxy &proxy)
    {
        QMutexLocker lock(&mutex);
        if (!applicationLevelProxy)
            applicationLevelProxy = new QNetworkProxy;
        *applicationLevelProxy = proxy;
        delete applicationLevelProxyFactory;
        applicationLevelProxyFactory = nullptr;
        useSystemProxies = false;
    }